

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LoudnessMeter.cpp
# Opt level: O2

void __thiscall
LoudnessMeter::LoudnessAnalyzer::Feed(LoudnessAnalyzer *this,float *inputs,int numchannels)

{
  ulong uVar1;
  ulong uVar2;
  float *pfVar3;
  float sample;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)numchannels;
  if (numchannels < 1) {
    uVar2 = uVar1;
  }
  sample = 0.0;
  fVar4 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    fVar5 = inputs[uVar1];
    fVar7 = this->peak[uVar1];
    pfVar3 = &this->release;
    if (fVar7 < ABS(fVar5)) {
      pfVar3 = &this->attack;
    }
    fVar6 = this->rms[uVar1];
    fVar7 = (ABS(fVar5) - fVar7) * *pfVar3 + fVar7;
    pfVar3 = &this->release;
    if (fVar6 < fVar5 * fVar5) {
      pfVar3 = &this->attack;
    }
    this->peak[uVar1] = fVar7;
    fVar6 = (fVar5 * fVar5 - fVar6) * *pfVar3 + fVar6;
    this->rms[uVar1] = fVar6;
    if (fVar7 <= sample) {
      fVar7 = sample;
    }
    sample = fVar7;
    if (fVar6 <= fVar4) {
      fVar6 = fVar4;
    }
    fVar4 = fVar6;
  }
  fVar5 = this->updatecount + -1.0;
  this->updatecount = fVar5;
  if (0.0 < fVar5) {
    return;
  }
  this->updatecount = fVar5 + this->updateperiod;
  HistoryBuffer::Feed(&this->peakbuf,sample);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  HistoryBuffer::Feed(&this->rmsbuf,fVar4);
  return;
}

Assistant:

inline void Feed(const float* inputs, int numchannels)
        {
            float maxPeak = 0.0f, maxRMS = 0.0f;
            for (int i = 0; i < numchannels; i++)
            {
                float x = inputs[i];
                x = fabsf(x);
                peak[i] += (x - peak[i]) * ((x > peak[i]) ? attack : release);
                x *= x;
                rms[i] += (x - rms[i]) * ((x > rms[i]) ? attack : release);
                if (peak[i] > maxPeak)
                    maxPeak = peak[i];
                if (rms[i] > maxRMS)
                    maxRMS = rms[i];
            }
            if (--updatecount <= 0.0f)
            {
                updatecount += updateperiod;
                peakbuf.Feed(maxPeak);
                rmsbuf.Feed(sqrtf(maxRMS));
            }
        }